

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::BlobProto::MergeFrom(BlobProto *this,Message *from)

{
  LogMessage *other;
  BlobProto *from_00;
  BlobProto *source;
  byte local_51;
  LogMessage local_50;
  Message *local_18;
  Message *from_local;
  BlobProto *this_local;
  
  local_51 = 0;
  local_18 = from;
  from_local = &this->super_Message;
  if ((BlobProto *)from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
               ,0xee4);
    local_51 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)((long)&source + 3),other);
  }
  if ((local_51 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  from_00 = google::protobuf::internal::DynamicCastToGenerated<caffe::BlobProto_const>(local_18);
  if (from_00 == (BlobProto *)0x0) {
    google::protobuf::internal::ReflectionOps::Merge(local_18,&this->super_Message);
  }
  else {
    MergeFrom(this,from_00);
  }
  return;
}

Assistant:

void BlobProto::MergeFrom(const ::google::protobuf::Message& from) {
// @@protoc_insertion_point(generalized_merge_from_start:caffe.BlobProto)
  GOOGLE_DCHECK_NE(&from, this);
  const BlobProto* source =
      ::google::protobuf::internal::DynamicCastToGenerated<const BlobProto>(
          &from);
  if (source == NULL) {
  // @@protoc_insertion_point(generalized_merge_from_cast_fail:caffe.BlobProto)
    ::google::protobuf::internal::ReflectionOps::Merge(from, this);
  } else {
  // @@protoc_insertion_point(generalized_merge_from_cast_success:caffe.BlobProto)
    MergeFrom(*source);
  }
}